

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O2

void __thiscall unittest::UnitTest::TestParseGenerate1W(UnitTest *this)

{
  bool result;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> os;
  wchar_t *local_1a0 [4];
  wostringstream local_180 [376];
  
  std::__cxx11::wostringstream::wostringstream(local_180);
  result = runtest<wchar_t>("test1.ini","test1.output",
                            (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_180);
  Assert::IsTrue(result);
  std::__cxx11::wstringbuf::str();
  Logger::WriteMessage(local_1a0[0]);
  std::__cxx11::wstring::~wstring((wstring *)local_1a0);
  std::__cxx11::wostringstream::~wostringstream(local_180);
  return;
}

Assistant:

TEST_METHOD(TestParseGenerate1W)
		{
			std::basic_ostringstream<wchar_t> os;
			Assert::IsTrue(runtest<wchar_t>("test1.ini", "test1.output", os));
			Logger::WriteMessage(os.str().c_str());
		}